

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O2

void __thiscall iqxmlrpc::Date_time::Date_time(Date_time *this,bool use_lt)

{
  undefined7 in_register_00000031;
  ptime p;
  ptime local_50;
  tm local_48;
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Date_time_0019efe0;
  (this->cache)._M_dataplus._M_p = (pointer)&(this->cache).field_2;
  (this->cache)._M_string_length = 0;
  (this->cache).field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000031,use_lt) == 0) {
    local_50 = boost::date_time::second_clock<boost::posix_time::ptime>::universal_time();
  }
  else {
    local_50 = boost::date_time::second_clock<boost::posix_time::ptime>::local_time();
  }
  boost::posix_time::to_tm(&local_48,&local_50);
  (this->tm_).tm_zone = local_48.tm_zone;
  (this->tm_).tm_isdst = local_48.tm_isdst;
  *(undefined4 *)&(this->tm_).field_0x24 = local_48._36_4_;
  (this->tm_).tm_gmtoff = local_48.tm_gmtoff;
  (this->tm_).tm_mon = local_48.tm_mon;
  (this->tm_).tm_year = local_48.tm_year;
  (this->tm_).tm_wday = local_48.tm_wday;
  (this->tm_).tm_yday = local_48.tm_yday;
  (this->tm_).tm_sec = local_48.tm_sec;
  (this->tm_).tm_min = local_48.tm_min;
  (this->tm_).tm_hour = local_48.tm_hour;
  (this->tm_).tm_mday = local_48.tm_mday;
  return;
}

Assistant:

Date_time::Date_time( bool use_lt )
{
  using namespace boost::posix_time;
  ptime p = use_lt ? second_clock::local_time() : second_clock::universal_time();
  tm_ = to_tm(p);
}